

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usprep.cpp
# Opt level: O0

int32_t usprep_map(UStringPrepProfile *profile,UChar *src,int32_t srcLength,UChar *dest,
                  int32_t destCapacity,int32_t options,UParseError *parseError,UErrorCode *status)

{
  ushort uVar1;
  int32_t iVar2;
  UStringPrepType UVar3;
  int iVar4;
  int local_70;
  uint local_6c;
  int32_t i;
  int32_t length;
  int32_t index;
  int32_t __offset;
  UChar __lead16;
  uint16_t __c2;
  UChar32 ch;
  int32_t *indexes;
  UBool isIndex;
  int16_t value;
  UStringPrepType type;
  int iStack_40;
  UBool allowUnassigned;
  int32_t srcIndex;
  int32_t destIndex;
  int32_t iStack_34;
  uint16_t result;
  int32_t options_local;
  int32_t destCapacity_local;
  UChar *dest_local;
  UChar *pUStack_20;
  int32_t srcLength_local;
  UChar *src_local;
  UStringPrepProfile *profile_local;
  
  iStack_40 = 0;
  value._1_1_ = (options & 1U) != 0;
  type = USPREP_UNASSIGNED;
  destIndex = options;
  iStack_34 = destCapacity;
  _options_local = dest;
  dest_local._4_4_ = srcLength;
  pUStack_20 = src;
  src_local = (UChar *)profile;
LAB_003e8bb1:
  while( true ) {
    if ((int)dest_local._4_4_ <= (int)type) {
      iVar2 = u_terminateUChars_63(_options_local,iStack_34,iStack_40,status);
      return iVar2;
    }
    UVar3 = type + USPREP_MAP;
    __offset = (int32_t)(ushort)pUStack_20[(int)type];
    if ((((__offset & 0xfffffc00U) == 0xd800) && (UVar3 != dest_local._4_4_)) &&
       ((pUStack_20[(int)UVar3] & 0xfc00U) == 0xdc00)) {
      __offset = __offset * 0x400 + (uint)(ushort)pUStack_20[(int)UVar3] + -0x35fdc00;
      UVar3 = type + USPREP_PROHIBITED;
    }
    type = UVar3;
    if ((uint)__offset < 0x10000) {
      iVar4 = 0;
      if (0xd7ff < __offset && __offset < 0xdc00) {
        iVar4 = 0x140;
      }
      srcIndex._2_2_ =
           *(uint16_t *)
            (*(long *)(src_local + 0x20) +
            (long)(int)((uint)*(ushort *)
                               (*(long *)(src_local + 0x20) + (long)(iVar4 + (__offset >> 5)) * 2) *
                        4 + (__offset & 0x1fU)) * 2);
    }
    else if ((uint)__offset < 0x110000) {
      uVar1 = (short)(__offset >> 10) + 0xd7c0;
      srcIndex._2_2_ =
           *(undefined2 *)
            (*(long *)(src_local + 0x20) +
            (long)(int)((uint)*(ushort *)
                               (*(long *)(src_local + 0x20) + (long)((int)(uint)uVar1 >> 5) * 2) * 4
                       + (uVar1 & 0x1f)) * 2);
      iVar4 = (**(code **)(src_local + 0x28))(srcIndex._2_2_);
      if (iVar4 < 1) {
        srcIndex._2_2_ = (uint16_t)*(undefined4 *)(src_local + 0x30);
      }
      else {
        srcIndex._2_2_ =
             *(uint16_t *)
              (*(long *)(src_local + 0x20) +
              (long)(int)((uint)*(ushort *)
                                 (*(long *)(src_local + 0x20) +
                                 (long)(iVar4 + ((int)(__offset & 0x3ffU) >> 5)) * 2) * 4 +
                         (__offset & 0x1fU)) * 2);
      }
    }
    else {
      srcIndex._2_2_ = (uint16_t)*(undefined4 *)(src_local + 0x30);
    }
    indexes._4_4_ =
         getValues(srcIndex._2_2_,(int16_t *)((long)&indexes + 2),(UBool *)((long)&indexes + 1));
    if ((indexes._4_4_ == USPREP_UNASSIGNED) && (value._1_1_ == '\0')) {
      iVar4 = 2;
      if ((uint)__offset < 0x10000) {
        iVar4 = 1;
      }
      uprv_syntaxError_63(pUStack_20,type - iVar4,dest_local._4_4_,parseError);
      *status = U_IDNA_UNASSIGNED_ERROR;
      return 0;
    }
    if (indexes._4_4_ != USPREP_MAP) goto LAB_003e8edf;
    if (indexes._1_1_ == '\0') break;
    iVar4 = (int)indexes._2_2_;
    i = iVar4;
    if ((iVar4 < profile->indexes[3]) || (profile->indexes[4] <= iVar4)) {
      if ((iVar4 < profile->indexes[4]) || (profile->indexes[5] <= iVar4)) {
        if ((iVar4 < profile->indexes[5]) || (profile->indexes[6] <= iVar4)) {
          i = iVar4 + 1;
          local_6c = (uint)*(ushort *)(*(long *)(src_local + 0x34) + (long)iVar4 * 2);
        }
        else {
          local_6c = 3;
        }
      }
      else {
        local_6c = 2;
      }
    }
    else {
      local_6c = 1;
    }
    for (local_70 = 0; local_70 < (int)local_6c; local_70 = local_70 + 1) {
      if (iStack_40 < iStack_34) {
        _options_local[iStack_40] =
             *(UChar *)(*(long *)(src_local + 0x34) + (long)(i + local_70) * 2);
      }
      iStack_40 = iStack_40 + 1;
    }
  }
  __offset = __offset - indexes._2_2_;
  goto LAB_003e8eec;
LAB_003e8edf:
  if (indexes._4_4_ != USPREP_DELETE) {
LAB_003e8eec:
    if (__offset < 0x10000) {
      if (iStack_40 < iStack_34) {
        _options_local[iStack_40] = (UChar)__offset;
      }
      iStack_40 = iStack_40 + 1;
    }
    else {
      if (iStack_40 + 1 < iStack_34) {
        _options_local[iStack_40] = (short)(__offset >> 10) + L'ퟀ';
        _options_local[iStack_40 + 1] = (UChar)__offset & 0x3ffU | 0xdc00;
      }
      iStack_40 = iStack_40 + 2;
    }
  }
  goto LAB_003e8bb1;
}

Assistant:

static int32_t 
usprep_map(  const UStringPrepProfile* profile, 
             const UChar* src, int32_t srcLength, 
             UChar* dest, int32_t destCapacity,
             int32_t options,
             UParseError* parseError,
             UErrorCode* status ){
    
    uint16_t result;
    int32_t destIndex=0;
    int32_t srcIndex;
    UBool allowUnassigned = (UBool) ((options & USPREP_ALLOW_UNASSIGNED)>0);
    UStringPrepType type;
    int16_t value;
    UBool isIndex;
    const int32_t* indexes = profile->indexes;

    // no error checking the caller check for error and arguments
    // no string length check the caller finds out the string length

    for(srcIndex=0;srcIndex<srcLength;){
        UChar32 ch;

        U16_NEXT(src,srcIndex,srcLength,ch);
        
        result=0;

        UTRIE_GET16(&profile->sprepTrie,ch,result);
        
        type = getValues(result, value, isIndex);

        // check if the source codepoint is unassigned
        if(type == USPREP_UNASSIGNED && allowUnassigned == FALSE){

            uprv_syntaxError(src,srcIndex-U16_LENGTH(ch), srcLength,parseError);
            *status = U_STRINGPREP_UNASSIGNED_ERROR;
            return 0;
            
        }else if(type == USPREP_MAP){
            
            int32_t index, length;

            if(isIndex){
                index = value;
                if(index >= indexes[_SPREP_ONE_UCHAR_MAPPING_INDEX_START] &&
                         index < indexes[_SPREP_TWO_UCHARS_MAPPING_INDEX_START]){
                    length = 1;
                }else if(index >= indexes[_SPREP_TWO_UCHARS_MAPPING_INDEX_START] &&
                         index < indexes[_SPREP_THREE_UCHARS_MAPPING_INDEX_START]){
                    length = 2;
                }else if(index >= indexes[_SPREP_THREE_UCHARS_MAPPING_INDEX_START] &&
                         index < indexes[_SPREP_FOUR_UCHARS_MAPPING_INDEX_START]){
                    length = 3;
                }else{
                    length = profile->mappingData[index++];
         
                }

                /* copy mapping to destination */
                for(int32_t i=0; i< length; i++){
                    if(destIndex < destCapacity  ){
                        dest[destIndex] = profile->mappingData[index+i];
                    }
                    destIndex++; /* for pre-flighting */
                }  
                continue;
            }else{
                // subtract the delta to arrive at the code point
                ch -= value;
            }

        }else if(type==USPREP_DELETE){
             // just consume the codepoint and contine
            continue;
        }
        //copy the code point into destination
        if(ch <= 0xFFFF){
            if(destIndex < destCapacity ){
                dest[destIndex] = (UChar)ch;
            }
            destIndex++;
        }else{
            if(destIndex+1 < destCapacity ){
                dest[destIndex]   = U16_LEAD(ch);
                dest[destIndex+1] = U16_TRAIL(ch);
            }
            destIndex +=2;
        }
       
    }
        
    return u_terminateUChars(dest, destCapacity, destIndex, status);
}